

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lcode.c
# Opt level: O2

void discharge2reg(FuncState *fs,expdesc *e,int reg)

{
  Instruction *pIVar1;
  int k;
  
  luaK_dischargevars(fs,e);
  switch(e->k) {
  case VNIL:
    luaK_nil(fs,reg,1);
    break;
  case VTRUE:
  case VFALSE:
    luaK_codeABC(fs,OP_LOADBOOL,reg,(uint)(e->k == VTRUE),0);
    break;
  case VK:
    k = (e->u).info;
    goto LAB_0011df91;
  case VKFLT:
    k = luaK_numberK(fs,(e->u).nval);
    goto LAB_0011df91;
  case VKINT:
    k = luaK_intK(fs,(e->u).ival);
LAB_0011df91:
    luaK_codek(fs,reg,k);
    break;
  case VNONRELOC:
    if ((e->u).info != reg) {
      luaK_code(fs,(e->u).info << 0x17 | reg << 6);
    }
    break;
  default:
    goto switchD_0011defe_caseD_8;
  case VRELOCABLE:
    pIVar1 = fs->f->code;
    pIVar1[(e->u).info] = (reg & 0xffU) << 6 | pIVar1[(e->u).info] & 0xffffc03f;
  }
  (e->u).info = reg;
  e->k = VNONRELOC;
switchD_0011defe_caseD_8:
  return;
}

Assistant:

static void discharge2reg(FuncState *fs, expdesc *e, int reg) {
    luaK_dischargevars(fs, e);
    switch (e->k) {
        case VNIL: {
            luaK_nil(fs, reg, 1);
            break;
        }
        case VFALSE:
        case VTRUE: {
            luaK_codeABC(fs, OP_LOADBOOL, reg, e->k == VTRUE, 0);
            break;
        }
        case VK: {
            luaK_codek(fs, reg, e->u.info);
            break;
        }
        case VKFLT: {
            luaK_codek(fs, reg, luaK_numberK(fs, e->u.nval));
            break;
        }
        case VKINT: {
            luaK_codek(fs, reg, luaK_intK(fs, e->u.ival));
            break;
        }
        case VRELOCABLE: {
            Instruction *pc = &getinstruction(fs, e);
            SETARG_A(*pc, reg);  /* instruction will put result in 'reg' */
            break;
        }
        case VNONRELOC: {
            if (reg != e->u.info)
                luaK_codeABC(fs, OP_MOVE, reg, e->u.info, 0);
            break;
        }
        default: {
            lua_assert(e->k == VJMP);
            return;  /* nothing to do... */
        }
    }
    e->u.info = reg;
    e->k = VNONRELOC;
}